

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

bool __thiscall Path::isHeader(Path *this)

{
  bool bVar1;
  char *ext;
  
  bVar1 = isFile(this);
  if (bVar1) {
    ext = extension(this,(size_t *)0x0);
    bVar1 = isHeader(ext);
    return bVar1;
  }
  return false;
}

Assistant:

bool Path::isHeader() const
{
    return isFile() && isHeader(extension());
}